

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O2

void lowbd_fwd_txfm2d_32x64_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  undefined1 auVar2 [32];
  int8_t *piVar3;
  undefined8 uVar4;
  __m256i *palVar5;
  int i;
  long lVar6;
  undefined1 *puVar7;
  __m256i *out;
  long lVar8;
  __m256i bufB [32];
  __m256i bufA [32];
  __m256i buf0 [64];
  __m256i buf1 [256];
  longlong local_3060 [128];
  longlong local_2c60 [128];
  longlong local_2860 [256];
  longlong local_2060 [2];
  undefined1 local_2050 [8224];
  
  piVar3 = av1_fwd_txfm_shift_ls[0xb];
  uVar4 = 0x4bc10b;
  palVar5 = (__m256i *)local_2060;
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    uVar4 = 0x40;
    load_buffer_16bit_to_16bit_avx2(input + lVar6 * 0x10,stride,(__m256i *)local_2860,0x40);
    round_shift_16bit_w16_avx2((__m256i *)local_2860,0x40,(int)*piVar3);
    fdct16x64_new_avx2((__m256i *)local_2860,(__m256i *)local_2860,'\r');
    round_shift_16bit_w16_avx2((__m256i *)local_2860,0x40,(int)piVar3[1]);
    out = palVar5;
    for (lVar8 = 0; lVar8 != 0x400; lVar8 = lVar8 + 0x200) {
      transpose_16bit_16x16_avx2((__m256i *)((long)local_2860 + lVar8),out);
      out = out + 0x20;
    }
    palVar5 = palVar5 + 0x10;
  }
  puVar7 = local_2050;
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    for (lVar8 = 0; lVar8 != 0x400; lVar8 = lVar8 + 0x20) {
      auVar2 = vpmovsxwd_avx2(*(undefined1 (*) [16])(puVar7 + lVar8 + -0x10));
      *(undefined1 (*) [32])((long)local_2c60 + lVar8) = auVar2;
      auVar2 = vpmovsxwd_avx2(*(undefined1 (*) [16])(puVar7 + lVar8));
      *(undefined1 (*) [32])((long)local_3060 + lVar8) = auVar2;
    }
    fdct32_avx2((__m256i *)local_2c60,(__m256i *)local_2c60,'\v');
    fdct32_avx2((__m256i *)local_3060,(__m256i *)local_3060,'\v');
    cVar1 = piVar3[2];
    round_shift_rect_array_32_avx2
              ((__m256i *)local_2c60,(__m256i *)local_2c60,-(int)cVar1,(int)uVar4,bd);
    round_shift_rect_array_32_avx2
              ((__m256i *)local_3060,(__m256i *)local_3060,-(int)cVar1,(int)uVar4,bd);
    store_output_32bit_w16
              (output + lVar6 * 0x10,(__m256i *)local_2c60,(__m256i *)local_3060,(int)uVar4,bd);
    puVar7 = puVar7 + 0x400;
  }
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_32x64_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_32X64;
  __m256i buf0[64], buf1[256];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = fdct16x64_new_avx2;
  const int width_div16 = (width >> 4);
  const int height_div16 = (height >> 4);

  for (int i = 0; i < width_div16; i++) {
    load_buffer_16bit_to_16bit_avx2(input + 16 * i, stride, buf0, height);
    round_shift_16bit_w16_avx2(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit_w16_avx2(buf0, height, shift[1]);
    for (int j = 0; j < AOMMIN(2, height_div16); ++j) {
      transpose_16bit_16x16_avx2(buf0 + j * 16, buf1 + j * width + 16 * i);
    }
  }

  for (int i = 0; i < AOMMIN(2, height_div16); i++) {
    __m256i bufA[32];
    __m256i bufB[32];
    __m128i *buf = (__m128i *)(buf1 + width * i);
    for (int j = 0; j < width; ++j) {
      bufA[j] = _mm256_cvtepi16_epi32(buf[j * 2]);
      bufB[j] = _mm256_cvtepi16_epi32(buf[j * 2 + 1]);
    }
    fdct32_avx2(bufA, bufA, cos_bit_row);
    fdct32_avx2(bufB, bufB, cos_bit_row);
    round_shift_rect_array_32_avx2(bufA, bufA, 32, -shift[2], NewSqrt2);
    round_shift_rect_array_32_avx2(bufB, bufB, 32, -shift[2], NewSqrt2);

    store_output_32bit_w16(output + i * 16, bufA, bufB, 32, 32);
  }
}